

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copied_statement_verifier.cpp
# Opt level: O1

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
__thiscall
duckdb::CopiedStatementVerifier::Create
          (CopiedStatementVerifier *this,SQLStatement *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  CopiedStatementVerifier *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> local_28;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_20;
  
  (*statement->_vptr_SQLStatement[3])(&local_28);
  this_00 = (CopiedStatementVerifier *)operator_new(0x50);
  local_20._M_head_impl =
       (SQLStatement *)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
       (_Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)0x0;
  CopiedStatementVerifier
            (this_00,(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)&local_20,parameters);
  if (local_20._M_head_impl != (SQLStatement *)0x0) {
    (*(local_20._M_head_impl)->_vptr_SQLStatement[1])();
  }
  (this->super_StatementVerifier)._vptr_StatementVerifier = (_func_int **)this_00;
  if (local_28._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                          .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl + 8))()
    ;
  }
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         this;
}

Assistant:

unique_ptr<StatementVerifier>
CopiedStatementVerifier::Create(const SQLStatement &statement,
                                optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	return make_uniq<CopiedStatementVerifier>(statement.Copy(), parameters);
}